

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void prvTidyDefineTag(TidyDocImpl *doc,UserTagType tagType,ctmbstr name)

{
  uint local_2c;
  uint vers;
  uint cm;
  Parser *parser;
  ctmbstr name_local;
  UserTagType tagType_local;
  TidyDocImpl *doc_local;
  
  _vers = (Parser *)0x0;
  local_2c = 0;
  switch(tagType) {
  case tagtype_null:
    break;
  case tagtype_empty:
    local_2c = 0x140001;
    _vers = prvTidyParseBlock;
    break;
  case tagtype_inline:
    local_2c = 0x140010;
    _vers = prvTidyParseInline;
    break;
  case tagtype_block:
    local_2c = 0x140008;
    _vers = prvTidyParseBlock;
    break;
  case tagtype_pre:
    local_2c = 0x140008;
    _vers = prvTidyParsePre;
  }
  if ((local_2c != 0) && (_vers != (Parser *)0x0)) {
    declare(doc,&doc->tags,name,0xe000,local_2c,_vers,(CheckAttribs *)0x0);
  }
  return;
}

Assistant:

void TY_(DefineTag)( TidyDocImpl* doc, UserTagType tagType, ctmbstr name )
{
    Parser* parser = 0;
    uint cm = CM_UNKNOWN;
    uint vers = VERS_PROPRIETARY;

    switch (tagType)
    {
    case tagtype_empty:
        cm = CM_EMPTY|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseBlock);
        break;

    case tagtype_inline:
        cm = CM_INLINE|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseInline);
        break;

    case tagtype_block:
        cm = CM_BLOCK|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseBlock);
        break;

    case tagtype_pre:
        cm = CM_BLOCK|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParsePre);
        break;

    case tagtype_null:
        break;
    }
    if ( cm && parser )
        declare( doc, &doc->tags, name, vers, cm, parser, 0 );
}